

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

enable_if_t<_Traits::isStreamWriter<const_char_*>::value,_Domain_&> __thiscall
Scine::Core::Log::Domain::operator<<(Domain *this,char **t)

{
  bool bVar1;
  reference this_00;
  element_type *peVar2;
  undefined8 *in_RSI;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>_>_>
  *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  *nameSinkPair;
  iterator __end3;
  iterator __begin3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>_>_>
  *__range3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>,_true>
  local_20 [2];
  undefined8 *local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>_>_>
       ::begin(in_RDI);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>_>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::__detail::operator!=(local_20,&local_28);
    if (!bVar1) break;
    this_00 = std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>,_false,_true>
              ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>,_false,_true>
                           *)0x131b39);
    peVar2 = std::
             __shared_ptr_access<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this_00);
    std::operator<<(peVar2,(char *)*local_10);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_>,_false,_true>
                  *)this_00);
  }
  return (enable_if_t<_Traits::isStreamWriter<const_char_*>::value,_Domain_&>)in_RDI;
}

Assistant:

std::enable_if_t<!Traits::isStreamWriter<T>::value, Domain&> operator<<(T&& t) {
      for (auto& nameSinkPair : sinks_) {
        *nameSinkPair.second << t;
      }
      return *this;
    }